

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

void __thiscall VkSpecParser::parseFeatureRequire(VkSpecParser *this,QString *versionDefine)

{
  byte bVar1;
  bool bVar2;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  QXmlStreamAttribute *attr;
  QXmlStreamAttributes *__range3;
  char16_t *str_1;
  char16_t *str;
  char16_t *str_2;
  iterator __end3;
  iterator __begin3;
  DataPointer *in_stack_fffffffffffffe08;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe18;
  byte in_stack_fffffffffffffe1c;
  undefined1 in_stack_fffffffffffffe1d;
  undefined1 uVar4;
  byte in_stack_fffffffffffffe1e;
  undefined1 uVar5;
  QString *key;
  undefined4 in_stack_fffffffffffffe38;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  QArrayDataPointer<char16_t> local_128 [2];
  QStringView local_e8;
  QXmlStreamAttribute *local_d8;
  iterator local_d0;
  iterator local_c8;
  QString local_c0;
  QArrayDataPointer<char16_t> local_a8 [2];
  undefined1 local_68 [16];
  QArrayDataPointer<char16_t> local_58 [2];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    bVar1 = QXmlStreamReader::atEnd();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    QXmlStreamReader::readNext();
    bVar2 = QXmlStreamReader::isEndElement((QXmlStreamReader *)0x103bd5);
    bVar8 = 0;
    bVar1 = 0;
    uVar5 = false;
    if (bVar2) {
      auVar3 = QXmlStreamReader::name();
      local_18 = auVar3;
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_58,(Data *)0x0,L"require",7);
      bVar8 = 1;
      QString::QString((QString *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      bVar1 = 1;
      QStringView::QStringView<QString,_true>
                (in_RDI,(QString *)
                        CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffe1e,
                                                CONCAT15(in_stack_fffffffffffffe1d,
                                                         CONCAT14(in_stack_fffffffffffffe1c,
                                                                  in_stack_fffffffffffffe18)))));
      uVar5 = operator==((QStringView *)in_stack_fffffffffffffe10,
                         (QStringView *)in_stack_fffffffffffffe08);
    }
    in_stack_fffffffffffffe1e = uVar5;
    uVar5 = in_stack_fffffffffffffe1e;
    if ((bVar1 & 1) != 0) {
      QString::~QString((QString *)0x103cb8);
    }
    if ((bVar8 & 1) != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe10);
    }
    if ((in_stack_fffffffffffffe1e & 1) != 0) break;
    bVar2 = QXmlStreamReader::isStartElement((QXmlStreamReader *)0x103ceb);
    bVar7 = 0;
    bVar6 = 0;
    uVar4 = false;
    if (bVar2) {
      auVar3 = QXmlStreamReader::name();
      local_68 = auVar3;
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_a8,(Data *)0x0,L"command",7);
      bVar7 = 1;
      QString::QString((QString *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      bVar6 = 1;
      QStringView::QStringView<QString,_true>
                (in_RDI,(QString *)
                        CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffe1e,
                                                CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffe1c,
                                                                        in_stack_fffffffffffffe18)))
                                ));
      uVar4 = operator==((QStringView *)in_stack_fffffffffffffe10,
                         (QStringView *)in_stack_fffffffffffffe08);
    }
    in_stack_fffffffffffffe1c = uVar4;
    in_stack_fffffffffffffe1d = in_stack_fffffffffffffe1c;
    if ((bVar6 & 1) != 0) {
      QString::~QString((QString *)0x103dce);
    }
    if ((bVar7 & 1) != 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe10);
    }
    if ((in_stack_fffffffffffffe1c & 1) != 0) {
      QXmlStreamReader::attributes();
      key = &local_c0;
      local_c8.i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
      local_c8 = QList<QXmlStreamAttribute>::begin
                           ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe10);
      local_d0.i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
      local_d0 = QList<QXmlStreamAttribute>::end
                           ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe10);
      while( true ) {
        local_d8 = local_d0.i;
        bVar2 = QList<QXmlStreamAttribute>::iterator::operator!=(&local_c8,local_d0);
        if (!bVar2) break;
        QList<QXmlStreamAttribute>::iterator::operator*(&local_c8);
        local_e8 = QXmlStreamAttribute::name((QXmlStreamAttribute *)0x103ecb);
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_128,(Data *)0x0,L"name",4);
        QString::QString((QString *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        QStringView::QStringView<QString,_true>
                  (in_RDI,(QString *)
                          CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffe1e,
                                                  CONCAT15(in_stack_fffffffffffffe1d,
                                                           CONCAT14(in_stack_fffffffffffffe1c,
                                                                    in_stack_fffffffffffffe18)))));
        bVar2 = operator==((QStringView *)in_stack_fffffffffffffe10,
                           (QStringView *)in_stack_fffffffffffffe08);
        in_stack_fffffffffffffe18 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe18);
        QString::~QString((QString *)0x103f72);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe10);
        if ((in_stack_fffffffffffffe18 & 0x1000000) != 0) {
          in_stack_fffffffffffffe10 =
               (QArrayDataPointer<char16_t> *)
               QMap<QString,_QList<QString>_>::operator[]
                         ((QMap<QString,_QList<QString>_> *)
                          CONCAT17(bVar8,CONCAT16(bVar1,CONCAT15(bVar7,CONCAT14(bVar6,
                                                  in_stack_fffffffffffffe38)))),key);
          QXmlStreamAttribute::value((QXmlStreamAttribute *)0x103fae);
          QStringView::toString((QStringView *)in_stack_fffffffffffffe10);
          QString::trimmed((QString *)in_stack_fffffffffffffe08);
          QList<QString>::append
                    ((QList<QString> *)in_stack_fffffffffffffe10,
                     (rvalue_ref)in_stack_fffffffffffffe08);
          QString::~QString((QString *)0x104007);
          QString::~QString((QString *)0x104014);
        }
        QList<QXmlStreamAttribute>::iterator::operator++(&local_c8);
      }
      QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x103e9b);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VkSpecParser::parseFeatureRequire(const QString &versionDefine)
{
    // <require comment="Device initialization">
    //   <command name="vkCreateInstance"/>

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("require"))
            return;
        if (m_reader.isStartElement() && m_reader.name() == QStringLiteral("command")) {
            for (const QXmlStreamAttribute &attr : m_reader.attributes()) {
                if (attr.name() == QStringLiteral("name"))
                    m_versionCommandMapping[versionDefine].append(attr.value().toString().trimmed());
            }
        }
    }
}